

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O1

void __thiscall
GmmLib::PageTable::AllocateDummyTables(PageTable *this,Table **L2Table,Table **L1Table)

{
  HANDLE pvVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Table *pTVar6;
  SyncInfo *pSVar7;
  undefined4 extraout_var_00;
  LastLevelTable *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar8;
  uint local_38;
  uint local_34;
  uint32_t PoolNodeIdx;
  uint32_t PoolNodeIdx_1;
  GmmPageTablePool *pGVar5;
  
  if (this->pClientContext != (GmmClientContext *)0x0) {
    local_38 = 0x200;
    iVar3 = (*this->PageTableMgr->_vptr_GmmPageTableMgr[4])(this->PageTableMgr,&local_38,3);
    pGVar5 = (GmmPageTablePool *)CONCAT44(extraout_var,iVar3);
    if (pGVar5 != (GmmPageTablePool *)0x0) {
      pTVar6 = (Table *)operator_new(0x30);
      uVar8 = local_38;
      if (pTVar6 == (Table *)0x0) {
        pTVar6 = (Table *)0x0;
      }
      else {
        pSVar7 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGVar5,local_38);
        pvVar1 = pSVar7->BBQueueHandle;
        uVar2 = pSVar7->BBFence;
        pTVar6->UsedEntries = (uint32_t *)0x0;
        pTVar6[1].PoolElem = (GMM_PAGETABLEPool *)0x0;
        pTVar6->PoolElem = pGVar5;
        (pTVar6->BBInfo).BBQueueHandle = pvVar1;
        (pTVar6->BBInfo).BBFence = uVar2;
        pTVar6->PoolNodeIdx = uVar8;
      }
      *L2Table = pTVar6;
      pGVar5->NodeUsage[(int)(local_38 / (uint)(this->NodesPerTable << 5))] =
           pGVar5->NodeUsage[(int)(local_38 / (uint)(this->NodesPerTable << 5))] |
           1 << ((byte)(local_38 / (uint)this->NodesPerTable) & 0x1f);
      pSVar7 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGVar5,local_38);
      pSVar7->BBQueueHandle = (HANDLE)0x0;
      pSVar7->BBFence = 0;
      pGVar5->NumFreeNodes = pGVar5->NumFreeNodes - this->NodesPerTable;
    }
    local_34 = 0x200;
    iVar3 = (*this->PageTableMgr->_vptr_GmmPageTableMgr[4])(this->PageTableMgr,&local_34,2);
    pGVar5 = (GmmPageTablePool *)CONCAT44(extraout_var_00,iVar3);
    if (pGVar5 != (GmmPageTablePool *)0x0) {
      this_00 = (LastLevelTable *)operator_new(0x38);
      uVar8 = local_34;
      if (this_00 == (LastLevelTable *)0x0) {
        this_00 = (LastLevelTable *)0x0;
      }
      else {
        iVar4 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        iVar3 = 0x20;
        if ((*(ulong *)(CONCAT44(extraout_var_01,iVar4) + 0x40) >> 0x2e & 1) == 0) {
          iVar3 = 8;
        }
        LastLevelTable::LastLevelTable(this_00,pGVar5,uVar8,iVar3,0);
      }
      *L1Table = &this_00->super_Table;
      if ((this_00 != (LastLevelTable *)0x0) && (local_34 != 0x200)) {
        uVar8 = 1;
        if (this->TTType == AUXTT) {
          iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar8 = 2;
          if (CONCAT44(extraout_var_02,iVar3) != 0) {
            iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            if ((*(byte *)(CONCAT44(extraout_var_03,iVar3) + 0x45) & 0x80) == 0) {
              iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
              uVar8 = 2 - ((*(byte *)(CONCAT44(extraout_var_04,iVar3) + 0x45) & 0x40) == 0);
            }
          }
        }
        pGVar5->NodeUsage[(ulong)local_34 / (ulong)(uVar8 << 5)] =
             pGVar5->NodeUsage[(ulong)local_34 / (ulong)(uVar8 << 5)] |
             1 << ((byte)(local_34 / uVar8) & 0x1f);
        pSVar7 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGVar5,local_34);
        pSVar7->BBQueueHandle = (HANDLE)0x0;
        pSVar7->BBFence = 0;
        pGVar5->NumFreeNodes = pGVar5->NumFreeNodes - uVar8;
      }
    }
  }
  return;
}

Assistant:

void GmmLib::PageTable::AllocateDummyTables(GmmLib::Table **L2Table, GmmLib::Table **L1Table)
{
    GMM_GFX_ADDRESS         L3TableAdr = GMM_NO_TABLE;
    GmmLib::LastLevelTable *pL1Tbl     = NULL;

    __GMM_ASSERTPTR(pClientContext, VOIDRETURN);

    if(TTL3.L3Handle)
    {
        L3TableAdr = TTL3.GfxAddress;
    }
    else
    {
        //Should never hit -- L3Table is allocated during device creation
        __GMM_ASSERT(false);
    }

    //Allocate dummy L2Table
    {
        uint32_t                   PoolNodeIdx = PAGETABLE_POOL_MAX_NODES;
        GmmLib::GMM_PAGETABLEPool *PoolElem    = NULL;
        POOL_TYPE                  PoolType    = POOL_TYPE_AUXTTL2;
        PoolElem                               = PageTableMgr->__GetFreePoolNode(&PoolNodeIdx, PoolType);
        if(PoolElem)
        {
            *L2Table = new GmmLib::MidLevelTable(PoolElem, PoolNodeIdx, PoolElem->GetNodeBBInfoAtIndex(PoolNodeIdx));
            ASSIGN_POOLNODE(PoolElem, PoolNodeIdx, NodesPerTable)
        }
    }

    //Allocate dummy L1Table
    {
        uint32_t                   PoolNodeIdx = PAGETABLE_POOL_MAX_NODES;
        GmmLib::GMM_PAGETABLEPool *PoolElem    = NULL;
        POOL_TYPE                  PoolType    = POOL_TYPE_AUXTTL1;

        PoolElem = PageTableMgr->__GetFreePoolNode(&PoolNodeIdx, PoolType); //Recognize if Aux-L1 being allocated
        if(PoolElem)
        {
            *L1Table = new GmmLib::LastLevelTable(PoolElem, PoolNodeIdx, GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext()), 0); // use TR vs Aux L1_Size_DWORD

            if(*L1Table)
            {
                if(PoolNodeIdx != PAGETABLE_POOL_MAX_NODES)
                {
                    uint32_t PerTableNodes = (TTType == AUXTT) ? AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetGmmLibContext()) : 1;
                    ASSIGN_POOLNODE(PoolElem, PoolNodeIdx, PerTableNodes)
                }
            }
        }
    }
}